

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O0

void __thiscall
QScrollerPrivate::updateVelocity(QScrollerPrivate *this,QPointF *deltaPixelRaw,qint64 deltaTime)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  QScrollerPropertiesPrivate *pQVar5;
  double *pdVar6;
  QDebug *pQVar7;
  long in_RDX;
  qreal *in_RSI;
  QScrollerPrivate *in_RDI;
  long in_FS_OFFSET;
  qreal qVar8;
  qreal qVar9;
  qreal qVar10;
  QPointF *pQVar11;
  qreal smoothing;
  QScrollerPropertiesPrivate *sp;
  QScroller *q;
  QPointF newv;
  QPointF deltaPixel;
  QPointF ppm;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_3;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_fffffffffffffcf8;
  QLoggingCategory *cat;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_fffffffffffffd00;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *this_00;
  QPointF *in_stack_fffffffffffffd08;
  QMessageLogger *in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd18;
  int in_stack_fffffffffffffd1c;
  QPointF *in_stack_fffffffffffffd20;
  QPointF *pQVar12;
  QPointF *in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  undefined7 in_stack_fffffffffffffd48;
  undefined1 in_stack_fffffffffffffd4f;
  undefined1 uVar13;
  QDebug local_248;
  QDebug local_240;
  QDebug local_238;
  qreal local_230;
  qreal local_228;
  qreal local_220;
  qreal local_218;
  QDebug local_1f0;
  QDebug local_1e8;
  QDebug local_1e0;
  QPointF local_1d8;
  QPointF local_1c8;
  QPointF local_1b8;
  QDebug local_188;
  QDebug local_180;
  QDebug local_178;
  QDebug local_170;
  QDebug local_168;
  QPointF local_160;
  double local_150;
  double local_148;
  QPointF local_140;
  QPointF local_130;
  QPointF local_120;
  QPointF local_110;
  QPointF local_100;
  QPointF local_f0;
  QPointF local_e0;
  QPointF local_d0;
  QPointF local_c0;
  QPointF local_b0;
  QDebug local_80;
  QDebug local_78;
  QDebug local_70;
  qreal local_68;
  qreal local_60;
  QPointF local_58;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDX < 1) goto LAB_00a86d84;
  q_func(in_RDI);
  local_58.yp = -NAN;
  local_58.xp = -NAN;
  local_58 = QScroller::pixelPerMeter
                       ((QScroller *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
  pQVar5 = QScopedPointer<QScrollerPropertiesPrivate,_QScopedPointerDeleter<QScrollerPropertiesPrivate>_>
           ::data(&(in_RDI->properties).d);
  local_68 = *in_RSI;
  local_60 = in_RSI[1];
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  lcScroller();
  anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_18), bVar2) {
    anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xa8637a);
    QMessageLogger::QMessageLogger
              (in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08,
               (int)((ulong)in_stack_fffffffffffffd00 >> 0x20),(char *)in_stack_fffffffffffffcf8,
               (char *)0xa86393);
    QMessageLogger::debug();
    pQVar7 = QDebug::operator<<((QDebug *)
                                CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                                (char *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48
                                                ));
    QDebug::QDebug(&local_78,pQVar7);
    ::operator<<((QDebug *)&local_70,(QPointF *)&local_78);
    QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                       (char *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffd00,(qint64)in_stack_fffffffffffffcf8);
    QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                       (char *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
    QDebug::~QDebug(&local_70);
    QDebug::~QDebug(&local_78);
    QDebug::~QDebug(&local_80);
    local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
  }
  local_b0 = operator/(in_stack_fffffffffffffd08,(qreal)in_stack_fffffffffffffd00);
  qVar8 = QPointF::manhattanLength(in_stack_fffffffffffffd08);
  qVar9 = QPointF::x(&local_58);
  qVar10 = QPointF::y(&local_58);
  if (2.5 < (qVar8 / ((qVar9 + qVar10) / 2.0)) * 1000.0) {
    local_f0 = ::operator*(in_stack_fffffffffffffd08,(qreal)in_stack_fffffffffffffd00);
    local_e0 = ::operator*(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
    local_d0 = operator/(in_stack_fffffffffffffd08,(qreal)in_stack_fffffffffffffd00);
    local_100 = operator/(in_stack_fffffffffffffd08,(qreal)in_stack_fffffffffffffd00);
    QPointF::manhattanLength(in_stack_fffffffffffffd08);
    local_c0 = operator/(in_stack_fffffffffffffd08,(qreal)in_stack_fffffffffffffd00);
    local_68 = local_c0.xp;
    local_60 = local_c0.yp;
  }
  local_110.yp = -NAN;
  local_110.xp = -NAN;
  local_140 = ::operator-(in_stack_fffffffffffffd08);
  local_130 = operator/(in_stack_fffffffffffffd08,(qreal)in_stack_fffffffffffffd00);
  local_120 = ::operator*(in_stack_fffffffffffffd08,(qreal)in_stack_fffffffffffffd00);
  local_110 = operator/(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  dVar1 = pQVar5->dragVelocitySmoothingFactor;
  local_148 = (double)in_RDX;
  local_150 = 50.0;
  pdVar6 = qMin<double>(&local_148,&local_150);
  pQVar11 = (QPointF *)((dVar1 * *pdVar6) / 50.0);
  QPointF::QPointF(&local_160,0.0,0.0);
  bVar2 = ::operator!=((QPointF *)in_stack_fffffffffffffd00,(QPointF *)in_stack_fffffffffffffcf8);
  uVar13 = bVar2 && in_RDX < 100;
  if ((bool)uVar13) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    lcScroller();
    anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_28), bVar2) {
      anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xa867aa);
      QMessageLogger::QMessageLogger
                (in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08,
                 (int)((ulong)in_stack_fffffffffffffd00 >> 0x20),(char *)in_stack_fffffffffffffcf8,
                 (char *)0xa867c3);
      QMessageLogger::debug();
      pQVar7 = QDebug::operator<<((QDebug *)
                                  CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                                  (char *)CONCAT17(uVar13,in_stack_fffffffffffffd48));
      QDebug::QDebug(&local_180,pQVar7);
      ::operator<<((QDebug *)&local_178,(QPointF *)&local_180);
      pQVar7 = QDebug::operator<<((QDebug *)
                                  CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                                  (char *)CONCAT17(uVar13,in_stack_fffffffffffffd48));
      QDebug::QDebug(&local_170,pQVar7);
      local_1c8 = ::operator*(in_stack_fffffffffffffd08,(qreal)in_stack_fffffffffffffd00);
      local_1d8 = ::operator*(in_stack_fffffffffffffd08,(qreal)in_stack_fffffffffffffd00);
      local_1b8 = ::operator+(in_stack_fffffffffffffd08,(QPointF *)in_stack_fffffffffffffd00);
      ::operator<<((QDebug *)&local_168,(QPointF *)&local_170);
      QDebug::~QDebug(&local_168);
      QDebug::~QDebug(&local_170);
      QDebug::~QDebug(&local_178);
      QDebug::~QDebug(&local_180);
      QDebug::~QDebug(&local_188);
      local_20 = (undefined1 *)((ulong)local_20 & 0xffffffffffffff00);
    }
    qVar8 = QPointF::x(&local_110);
    if ((qVar8 != 0.0) || (NAN(qVar8))) {
      qVar8 = QPointF::x(&in_RDI->releaseVelocity);
      iVar4 = qSign(qVar8);
      qVar8 = QPointF::x(&local_110);
      iVar3 = qSign(qVar8);
      if (iVar4 == iVar3) goto LAB_00a86975;
    }
    else {
LAB_00a86975:
      qVar8 = QPointF::x(&local_110);
      pQVar12 = pQVar11;
      qVar9 = QPointF::x(&in_RDI->releaseVelocity);
      QPointF::setX(&local_110,qVar8 * (double)pQVar12 + qVar9 * (1.0 - (double)pQVar11));
    }
    qVar8 = QPointF::y(&local_110);
    if ((qVar8 != 0.0) || (NAN(qVar8))) {
      qVar8 = QPointF::y(&in_RDI->releaseVelocity);
      in_stack_fffffffffffffd1c = qSign(qVar8);
      qVar8 = QPointF::y(&local_110);
      iVar4 = qSign(qVar8);
      if (in_stack_fffffffffffffd1c != iVar4) goto LAB_00a86b91;
    }
    in_stack_fffffffffffffd10 = (QMessageLogger *)QPointF::y(&local_110);
    in_stack_fffffffffffffd08 = pQVar11;
    qVar8 = QPointF::y(&in_RDI->releaseVelocity);
    QPointF::setY(&local_110,
                  (double)in_stack_fffffffffffffd10 * (double)in_stack_fffffffffffffd08 +
                  qVar8 * (1.0 - (double)pQVar11));
  }
  else {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    lcScroller();
    anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_38), bVar2) {
      anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xa86aec);
      QMessageLogger::QMessageLogger
                (in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08,
                 (int)((ulong)in_stack_fffffffffffffd00 >> 0x20),(char *)in_stack_fffffffffffffcf8,
                 (char *)0xa86b05);
      QMessageLogger::debug();
      pQVar7 = QDebug::operator<<((QDebug *)
                                  CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                                  (char *)CONCAT17(uVar13,in_stack_fffffffffffffd48));
      QDebug::QDebug(&local_1e8,pQVar7);
      ::operator<<((QDebug *)&local_1e0,(QPointF *)&local_1e8);
      QDebug::~QDebug(&local_1e0);
      QDebug::~QDebug(&local_1e8);
      QDebug::~QDebug(&local_1f0);
      local_30 = (undefined1 *)((ulong)local_30 & 0xffffffffffffff00);
    }
  }
LAB_00a86b91:
  cat = (QLoggingCategory *)&in_RDI->releaseVelocity;
  local_218 = -pQVar5->maximumVelocity;
  local_220 = QPointF::x(&local_110);
  pdVar6 = qBound<double>((double *)in_stack_fffffffffffffd10,&in_stack_fffffffffffffd08->xp,
                          (double *)in_stack_fffffffffffffd00);
  QPointF::setX((QPointF *)cat,*pdVar6);
  this_00 = (QLoggingCategoryMacroHolder<(QtMsgType)0> *)&in_RDI->releaseVelocity;
  local_228 = -pQVar5->maximumVelocity;
  local_230 = QPointF::y(&local_110);
  pdVar6 = qBound<double>((double *)in_stack_fffffffffffffd10,&in_stack_fffffffffffffd08->xp,
                          (double *)this_00);
  QPointF::setY((QPointF *)this_00,*pdVar6);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  lcScroller();
  anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            (this_00,cat);
  while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_48), bVar2) {
    anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xa86cdd);
    QMessageLogger::QMessageLogger
              (in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08,
               (int)((ulong)this_00 >> 0x20),(char *)cat,(char *)0xa86cf6);
    QMessageLogger::debug();
    pQVar7 = QDebug::operator<<((QDebug *)
                                CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                                (char *)CONCAT17(uVar13,in_stack_fffffffffffffd48));
    QDebug::QDebug(&local_240,pQVar7);
    ::operator<<((QDebug *)&local_238,(QPointF *)&local_240);
    QDebug::~QDebug(&local_238);
    QDebug::~QDebug(&local_240);
    QDebug::~QDebug(&local_248);
    local_40 = (undefined1 *)((ulong)local_40 & 0xffffffffffffff00);
  }
LAB_00a86d84:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QScrollerPrivate::updateVelocity(const QPointF &deltaPixelRaw, qint64 deltaTime)
{
    if (deltaTime <= 0)
        return;

    Q_Q(QScroller);
    QPointF ppm = q->pixelPerMeter();
    const QScrollerPropertiesPrivate *sp = properties.d.data();
    QPointF deltaPixel = deltaPixelRaw;

    qCDebug(lcScroller) << "QScroller::updateVelocity(" << deltaPixelRaw
                        << " [delta pix], " << deltaTime << " [delta ms])";

    // faster than 2.5mm/ms seems bogus (that would be a screen height in ~20 ms)
    if (((deltaPixelRaw / qreal(deltaTime)).manhattanLength() / ((ppm.x() + ppm.y()) / 2) * 1000) > qreal(2.5))
        deltaPixel = deltaPixelRaw * qreal(2.5) * ppm / 1000 / (deltaPixelRaw / qreal(deltaTime)).manhattanLength();

    QPointF newv = -deltaPixel / qreal(deltaTime) * qreal(1000) / ppm;
    // around 95% of all updates are in the [1..50] ms range, so make sure
    // to scale the smoothing factor over that range: this way a 50ms update
    // will have full impact, while 5ms update will only have a 10% impact.
    qreal smoothing = sp->dragVelocitySmoothingFactor * qMin(qreal(deltaTime), qreal(50)) / qreal(50);

    // only smooth if we already have a release velocity and only if the
    // user hasn't stopped to move his finger for more than 100ms
    if ((releaseVelocity != QPointF(0, 0)) && (deltaTime < 100)) {
        qCDebug(lcScroller) << "SMOOTHED from " << newv << " to "
                            << newv * smoothing + releaseVelocity * (qreal(1) - smoothing);
        // smooth x or y only if the new velocity is either 0 or at least in
        // the same direction of the release velocity
        if (!newv.x() || (qSign(releaseVelocity.x()) == qSign(newv.x())))
            newv.setX(newv.x() * smoothing + releaseVelocity.x() * (qreal(1) - smoothing));
        if (!newv.y() || (qSign(releaseVelocity.y()) == qSign(newv.y())))
            newv.setY(newv.y() * smoothing + releaseVelocity.y() * (qreal(1) - smoothing));
    } else
        qCDebug(lcScroller) << "NO SMOOTHING to " << newv;

    releaseVelocity.setX(qBound(-sp->maximumVelocity, newv.x(), sp->maximumVelocity));
    releaseVelocity.setY(qBound(-sp->maximumVelocity, newv.y(), sp->maximumVelocity));

    qCDebug(lcScroller) << "  --> new velocity:" << releaseVelocity;
}